

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint Kit_DsdGetSupports_rec(Kit_DsdNtk_t *p,int iLit)

{
  ushort uVar1;
  Kit_DsdObj_t *pKVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar5 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  if (uVar5 < (uint)p->nNodes + (uint)uVar1) {
    if (uVar5 < uVar1) {
      uVar3 = 0;
      if (p->pSupps != (uint *)0x0) {
        uVar3 = 1 << ((byte)uVar5 & 0x1f);
      }
    }
    else {
      lVar4 = (ulong)uVar5 - (ulong)uVar1;
      pKVar2 = p->pNodes[lVar4];
      if (pKVar2 == (Kit_DsdObj_t *)0x0) {
        if (p->pSupps != (uint *)0x0) {
          return p->pSupps[lVar4];
        }
      }
      else {
        if (0x3ffffff < (uint)*pKVar2) {
          uVar6 = 0;
          uVar5 = 0;
          do {
            uVar3 = Kit_DsdGetSupports_rec
                              (p,(uint)*(ushort *)((long)&pKVar2[1].field_0x0 + uVar6 * 2));
            uVar5 = uVar5 | uVar3;
            uVar6 = uVar6 + 1;
          } while (uVar6 < (uint)*pKVar2 >> 0x1a);
          p->pSupps[(ulong)((uint)*pKVar2 & 0x3f) - (ulong)p->nVars] = uVar5;
          if (uVar5 < 0x10000) {
            return uVar5;
          }
          __assert_fail("uSupport <= 0xFFFF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                        ,0x6d4,"unsigned int Kit_DsdGetSupports_rec(Kit_DsdNtk_t *, int)");
        }
        p->pSupps[(ulong)((uint)*pKVar2 & 0x3f) - (ulong)uVar1] = 0;
      }
      uVar3 = 0;
    }
    return uVar3;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned Kit_DsdGetSupports_rec( Kit_DsdNtk_t * p, int iLit )
{
    Kit_DsdObj_t * pObj;
    unsigned uSupport, k;
    int iFaninLit;
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return Kit_DsdLitSupport( p, iLit );
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        uSupport |= Kit_DsdGetSupports_rec( p, iFaninLit );
    p->pSupps[pObj->Id - p->nVars] = uSupport;
    assert( uSupport <= 0xFFFF );
    return uSupport;
}